

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Attribute::
get_value<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
          (Attribute *this,
          vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *v)

{
  pointer ptVar1;
  pointer ptVar2;
  optional<std::vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>_>
  local_30;
  
  if ((v != (vector<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_> *)0x0
      ) && (primvar::PrimVar::
            get_value<std::vector<tinyusdz::value::texcoord3f,std::allocator<tinyusdz::value::texcoord3f>>>
                      (&local_30,&this->_var), local_30.has_value_ == true)) {
    ptVar1 = (v->
             super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ptVar2 = (v->
             super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>
             )._M_impl.super__Vector_impl_data._M_end_of_storage;
    (v->
    super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)local_30.contained.data._0_8_;
    (v->
    super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_30.contained._8_8_;
    (v->
    super__Vector_base<tinyusdz::value::texcoord3f,_std::allocator<tinyusdz::value::texcoord3f>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_30.contained._16_8_;
    if (ptVar1 == (pointer)0x0) {
      return true;
    }
    operator_delete(ptVar1,(long)ptVar2 - (long)ptVar1);
    return true;
  }
  return false;
}

Assistant:

bool get_value(T *v) const {
    if (!v) {
      return false;
    }

    nonstd::optional<T> ret = _var.get_value<T>();
    if (ret) {
      (*v) = std::move(ret.value());
      return true;
    }

    return false;
  }